

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QNetworkCookie>::insert
          (QMovableArrayOps<QNetworkCookie> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QNetworkCookie **ppQVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QNetworkCookie copy;
  Inserter local_60;
  QNetworkCookie local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d.ptr = (QSharedDataPointer<QNetworkCookiePrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCookie::QNetworkCookie(&local_38,t);
  bVar3 = (this->super_QGenericArrayOps<QNetworkCookie>).super_QArrayDataPointer<QNetworkCookie>.
          size != 0;
  QArrayDataPointer<QNetworkCookie>::detachAndGrow
            ((QArrayDataPointer<QNetworkCookie> *)this,(uint)(i == 0 && bVar3),n,
             (QNetworkCookie **)0x0,(QArrayDataPointer<QNetworkCookie> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      QNetworkCookie::QNetworkCookie
                ((this->super_QGenericArrayOps<QNetworkCookie>).
                 super_QArrayDataPointer<QNetworkCookie>.ptr + -1,&local_38);
      ppQVar1 = &(this->super_QGenericArrayOps<QNetworkCookie>).
                 super_QArrayDataPointer<QNetworkCookie>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QNetworkCookie>).
                super_QArrayDataPointer<QNetworkCookie>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_60,(QArrayDataPointer<QNetworkCookie> *)this,i,n);
    Inserter::insertFill(&local_60,&local_38,n);
    Inserter::~Inserter(&local_60);
  }
  QNetworkCookie::~QNetworkCookie(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }